

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender3F1S.cpp
# Opt level: O0

void * flow_thread(void *thread_args)

{
  code *pcVar1;
  int iVar2;
  char *__filename;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  FILE *__n;
  int in_R8D;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  FILE *local_c8;
  size_t message_size;
  size_t read;
  void *watch;
  char *buffer;
  char errmsg [32];
  FILE *local_70;
  FILE *file;
  size_t buffsize;
  string filename;
  SenderFlow *sf;
  flow_thread_args *args;
  double megabits;
  unsigned_long throughput;
  unsigned_long elapsed;
  int message_count;
  void *thread_args_local;
  
  elapsed._4_4_ = 0;
  filename.field_2._8_8_ = *thread_args;
  std::__cxx11::string::string((string *)&buffsize,(string *)((long)thread_args + 8));
  file = *(FILE **)((long)thread_args + 0x28);
  __filename = (char *)std::__cxx11::string::c_str();
  local_70 = fopen(__filename,"r");
  if (local_70 == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    sprintf((char *)&buffer,"fopen(\"%s\")",uVar3);
    perror((char *)&buffer);
    __raii_file((FILE **)&local_70);
    std::__cxx11::string::~string((string *)&buffsize);
    return (void *)0x0;
  }
  watch = operator_new__((ulong)file);
  read = zmq_stopwatch_start();
  while( true ) {
    iVar2 = feof(local_70);
    if (iVar2 != 0) break;
    __n = local_70;
    message_size = fread(watch,1,(size_t)file,local_70);
    SenderFlow::send((SenderFlow *)filename.field_2._8_8_,(int)watch,(void *)message_size,
                     (size_t)__n,in_R8D);
    elapsed._4_4_ = elapsed._4_4_ + 1;
  }
  if (watch != (void *)0x0) {
    operator_delete__(watch);
  }
  throughput = zmq_stopwatch_stop(read);
  if (throughput == 0) {
    throughput = 1;
  }
  local_c8 = file;
  auVar8._8_4_ = (int)(throughput >> 0x20);
  auVar8._0_8_ = throughput;
  auVar8._12_4_ = 0x45300000;
  dVar6 = ((double)(int)elapsed._4_4_ /
          ((auVar8._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)throughput) - 4503599627370496.0))) * 1000000.0;
  uVar4 = (ulong)dVar6;
  uVar4 = uVar4 | (long)(dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f;
  lVar5 = uVar4 * (long)file * 8;
  auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar7._0_8_ = lVar5;
  auVar7._12_4_ = 0x45300000;
  SenderFlow::name_abi_cxx11_(&local_e8,(SenderFlow *)filename.field_2._8_8_);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s. message size: %d [B]\n",uVar3,(ulong)local_c8 & 0xffffffff);
  std::__cxx11::string::~string((string *)&local_e8);
  SenderFlow::name_abi_cxx11_(&local_108,(SenderFlow *)filename.field_2._8_8_);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s. message count: %d\n",uVar3,(ulong)elapsed._4_4_);
  std::__cxx11::string::~string((string *)&local_108);
  SenderFlow::name_abi_cxx11_(&local_128,(SenderFlow *)filename.field_2._8_8_);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s. mean throughput: %d [msg/s]\n",uVar3,uVar4 & 0xffffffff);
  std::__cxx11::string::~string((string *)&local_128);
  SenderFlow::name_abi_cxx11_(&local_148,(SenderFlow *)filename.field_2._8_8_);
  uVar3 = std::__cxx11::string::c_str();
  printf("%s. mean throughput: %.3f [Mb/s]\n",
         ((auVar7._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 1000000.0,uVar3);
  std::__cxx11::string::~string((string *)&local_148);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void *flow_thread(void *thread_args)
{
    int message_count = 0;
    unsigned long elapsed;
    unsigned long throughput;
    double megabits;

    // Get thread arguments
    struct flow_thread_args *args = (struct flow_thread_args*)thread_args;
    SenderFlow *sf = args->flow;
    std::string filename = args->filename;
    size_t buffsize = args->buffsize;

    FILE *file __attribute__((cleanup (__raii_file))) =
        fopen(filename.c_str(), "r");
    if (file == NULL) {
        char errmsg[32];
        sprintf(errmsg, "fopen(\"%s\")", filename.c_str());
        perror(errmsg);
        return NULL;
    }

    char *buffer = new char[buffsize];
    void *watch = zmq_stopwatch_start();

    while (!feof(file)) {
        size_t read = fread(buffer, 1, buffsize, file);
        sf->send(buffer, read);
        message_count++;
    }
    delete[] buffer;

    elapsed = zmq_stopwatch_stop (watch);
    if (elapsed == 0)
        elapsed = 1;

    size_t message_size = buffsize;
    throughput = (unsigned long) ((double) message_count / (double) elapsed * 1000000);
    megabits = (double) (throughput * message_size * 8) / 1000000;

    printf ("%s. message size: %d [B]\n", sf->name().c_str(), (int) message_size);
    printf ("%s. message count: %d\n", sf->name().c_str(), (int) message_count);
    printf ("%s. mean throughput: %d [msg/s]\n", sf->name().c_str(), (int) throughput);
    printf ("%s. mean throughput: %.3f [Mb/s]\n", sf->name().c_str(), (double) megabits);
}